

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wtmath.c
# Opt level: O2

void dwt_per_stride(double *inp,int N,double *lpd,double *hpd,int lpd_len,double *cA,int len_cA,
                   double *cD,int istride,int ostride)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  ulong uVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  ulong uVar18;
  double *pdVar19;
  
  iVar8 = N % 2;
  uVar13 = 0;
  uVar10 = (ulong)(uint)lpd_len;
  if (lpd_len < 1) {
    uVar10 = uVar13;
  }
  uVar17 = (ulong)(uint)len_cA;
  if (len_cA < 1) {
    uVar17 = uVar13;
  }
  iVar11 = (int)((long)lpd_len / 2);
  iVar4 = iVar11 - N;
  iVar2 = iVar11 + 1;
  uVar18 = (long)lpd_len / 2 & 0xffffffff;
  uVar7 = 0;
  iVar1 = iVar4;
  do {
    if (uVar7 == uVar17) {
      return;
    }
    lVar6 = uVar7 * (long)ostride;
    cA[lVar6] = 0.0;
    cD[lVar6] = 0.0;
    iVar15 = (int)uVar18;
    uVar14 = uVar13;
    for (uVar9 = 0; uVar10 != uVar9; uVar9 = uVar9 + 1) {
      iVar16 = (int)uVar18;
      iVar12 = (int)uVar14;
      iVar5 = iVar11;
      if ((iVar16 < N && iVar11 <= iVar16) || (-1 < iVar16 && iVar16 < iVar11)) {
LAB_0010ea3f:
        pdVar19 = inp + (iVar5 * istride + iVar12);
LAB_0010ea46:
        cA[lVar6] = lpd[uVar9] * *pdVar19 + cA[lVar6];
        cD[lVar6] = hpd[uVar9] * *pdVar19 + cD[lVar6];
      }
      else {
        iVar5 = iVar11 + N;
        if (iVar16 < 0 && iVar8 == 0) {
LAB_0010eaac:
          pdVar19 = inp + (iVar5 * istride + iVar12);
          goto LAB_0010ea46;
        }
        iVar5 = iVar11 + N + 1;
        iVar3 = iVar2;
        if (iVar8 == 1 && iVar16 < 0) {
joined_r0x0010eaed:
          pdVar19 = inp + (N + -1) * istride;
          if (iVar3 != (int)uVar9) goto LAB_0010ea3f;
          goto LAB_0010ea46;
        }
        iVar5 = iVar4;
        if (N <= iVar16 && iVar8 == 0) goto LAB_0010eaac;
        iVar5 = iVar4 + -1;
        iVar3 = iVar1;
        if (iVar8 == 1 && N <= iVar16) goto joined_r0x0010eaed;
      }
      uVar18 = (ulong)(iVar16 - 1);
      uVar14 = (ulong)(uint)(iVar12 - istride);
    }
    uVar7 = uVar7 + 1;
    uVar18 = (ulong)(iVar15 + 2);
    uVar13 = (ulong)(uint)((int)uVar13 + istride * 2);
    iVar1 = iVar1 + 2;
    iVar2 = iVar2 + 2;
  } while( true );
}

Assistant:

void dwt_per_stride(double *inp, int N, double *lpd,double*hpd,int lpd_len,double *cA, int len_cA, double *cD, int istride, int ostride) {
	int l, l2, isodd, i, t, len_avg,is,os;

	len_avg = lpd_len;
	l2 = len_avg / 2;
	isodd = N % 2;

	for (i = 0; i < len_cA; ++i) {
		t = 2 * i + l2;
		os = i *ostride;
		cA[os] = 0.0;
		cD[os] = 0.0;
		for (l = 0; l < len_avg; ++l) {
			if ((t - l) >= l2 && (t - l) < N) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < l2 && (t - l) >= 0) {
				is = (t - l) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 0) {
				is = (t - l + N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) < 0 && isodd == 1) {
				if ((t - l) != -1) {
					is = (t - l + N + 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}
			else if ((t - l) >= N && isodd == 0) {
				is = (t - l - N) * istride;
				cA[os] += lpd[l] * inp[is];
				cD[os] += hpd[l] * inp[is];
			}
			else if ((t - l) >= N && isodd == 1) {
				is = (t - l - (N + 1)) * istride;
				if (t - l != N) {
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
				else {
					is = (N - 1) * istride;
					cA[os] += lpd[l] * inp[is];
					cD[os] += hpd[l] * inp[is];
				}
			}

		}
		
	}

}